

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampBase.cpp
# Opt level: O2

void __thiscall
glcts::TextureBorderClampBase::TextureBorderClampBase
          (TextureBorderClampBase *this,Context *context,ExtParameters *extParams,char *name,
          char *description)

{
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBorderClampBase_01e03370;
  this->m_texture_2D_array_id = 0;
  this->m_texture_2D_id = 0;
  this->m_texture_2D_multisample_array_id = 0;
  this->m_texture_2D_multisample_id = 0;
  this->m_texture_3D_id = 0;
  this->m_texture_buffer_id = 0;
  this->m_texture_cube_map_id = 0;
  this->m_texture_cube_map_array_id = 0;
  (this->m_texture_target_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_texture_target_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_texture_target_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TextureBorderClampBase::TextureBorderClampBase(Context& context, const ExtParameters& extParams, const char* name,
											   const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_texture_2D_array_id(0)
	, m_texture_2D_id(0)
	, m_texture_2D_multisample_array_id(0)
	, m_texture_2D_multisample_id(0)
	, m_texture_3D_id(0)
	, m_texture_buffer_id(0)
	, m_texture_cube_map_id(0)
	, m_texture_cube_map_array_id(0)
{
	/* Left blank on purpose */
}